

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorList.c
# Opt level: O2

int AllocateCubeSets(int nVarsIn,int nVarsOut)

{
  s_List = (Cube *)0x0;
  s_fDistEnable3 = 0;
  s_fDistEnable4 = 0;
  s_CubeGroup[4] = (Cube *)0x0;
  s_fInserted[4] = 0;
  s_fDecreaseLiterals = 0;
  s_cEnquequed = 0;
  s_cAttempts = 0;
  s_cReshapes = 0;
  s_nCubesBefore = 0;
  s_GainTotal = 0;
  s_fDistEnable2 = 1;
  s_GroupCounter = 0;
  s_pC2 = (Cube *)0x0;
  s_CubeGroup[0] = (Cube *)0x0;
  s_CubeGroup[1] = (Cube *)0x0;
  s_pC1 = (Cube *)0x0;
  s_CubeGroup[2] = (Cube *)0x0;
  s_CubeGroup[3] = (Cube *)0x0;
  s_fInserted[0] = 0;
  s_fInserted[1] = 0;
  s_fInserted[2] = 0;
  s_fInserted[3] = 0;
  return 4;
}

Assistant:

int AllocateCubeSets( int nVarsIn, int nVarsOut )
{
    s_List = NULL;

    // clean other data
    s_fDistEnable2 = 1;
    s_fDistEnable3 = 0;
    s_fDistEnable4 = 0;
    memset( s_CubeGroup, 0, sizeof(void *) * 5 );
    memset( s_fInserted, 0, sizeof(int) * 5 );
    s_fDecreaseLiterals = 0;
    s_cEnquequed = 0;
    s_cAttempts = 0;
    s_cReshapes = 0;
    s_nCubesBefore = 0;
    s_Gain = 0;
    s_GainTotal = 0;
    s_GroupCounter = 0;
    s_GroupBest = 0;
    s_pC1 = s_pC2 = NULL;

    return 4;
}